

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void glist_write(_glist *x,t_symbol *filename,t_symbol *format)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  _glist *in_RAX;
  _glist *x_00;
  _binbuf *x_01;
  uint crflag;
  char buf [1000];
  
  x_00 = glist_getcanvas(in_RAX);
  canvas_makefilename(x_00,filename->s_name,buf,1000);
  pbVar2 = (byte *)format->s_name;
  bVar1 = *pbVar2;
  crflag = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 == 99) && (pbVar2[1] == 0x72)) && (pbVar2[2] == 0)) {
      crflag = 1;
    }
    else {
      crflag = 0;
      pd_error((void *)0x0,"qlist_read: unknown flag: %s");
    }
  }
  x_01 = glist_writetobinbuf(x,1);
  if (x_01 != (_binbuf *)0x0) {
    iVar3 = binbuf_write(x_01,buf,"",crflag);
    if (iVar3 != 0) {
      pd_error((void *)0x0,"%s: write failed",filename->s_name);
    }
    binbuf_free(x_01);
  }
  return;
}

Assistant:

static void glist_write(t_glist *x, t_symbol *filename, t_symbol *format)
{
    int cr = 0;
    t_binbuf *b;
    char buf[MAXPDSTRING];
    t_canvas *canvas = glist_getcanvas(x);
    canvas_makefilename(canvas, filename->s_name, buf, MAXPDSTRING);
    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(0, "qlist_read: unknown flag: %s", format->s_name);

    b = glist_writetobinbuf(x, 1);
    if (b)
    {
        if (binbuf_write(b, buf, "", cr))
            pd_error(0, "%s: write failed", filename->s_name);
        binbuf_free(b);
    }
}